

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O1

bool __thiscall cmCTestUploadCommand::CheckArgumentValue(cmCTestUploadCommand *this,string *arg)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  ostream *poVar3;
  string filename;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  undefined1 local_198 [376];
  
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    pcVar1 = (arg->_M_dataplus)._M_p;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar1,pcVar1 + arg->_M_string_length);
    bVar2 = cmsys::SystemTools::FileExists(local_1d8._M_dataplus._M_p);
    if (bVar2) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->Files,&local_1d8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"File \"",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" does not exist. Cannot submit ",0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a non-existent file.",0x14);
      this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    return bVar2;
  }
  bVar2 = cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
  return bVar2;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentValue(std::string const& arg)
{
  if(this->ArgumentDoing == ArgumentDoingFiles)
    {
    std::string filename(arg);
    if(cmSystemTools::FileExists(filename.c_str()))
      {
      this->Files.insert(filename);
      return true;
      }
    else
      {
      std::ostringstream e;
      e << "File \"" << filename << "\" does not exist. Cannot submit "
          << "a non-existent file.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
      return false;
      }
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}